

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_cmpa(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 src_00;
  TCGv_i32 dest;
  TCGv_i32 reg;
  TCGv_i32 src;
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  pTVar1 = s->uc->tcg_ctx;
  if ((insn & 0x100) == 0) {
    src._4_4_ = 1;
  }
  else {
    src._4_4_ = 2;
  }
  src_00 = gen_ea(env,s,insn,src._4_4_,pTVar1->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                  (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (src_00 == pTVar1->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    dest = get_areg(s,(int)(uint)insn >> 9 & 7);
    gen_update_cc_cmp(s,dest,src_00,2);
  }
  return;
}

Assistant:

DISAS_INSN(cmpa)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opsize;
    TCGv src;
    TCGv reg;

    if (insn & 0x100) {
        opsize = OS_LONG;
    } else {
        opsize = OS_WORD;
    }
    SRC_EA(env, src, opsize, 1, NULL);
    reg = AREG(insn, 9);
    gen_update_cc_cmp(s, reg, src, OS_LONG);
}